

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall World::UpdateAdminCount(World *this,int admin_count)

{
  mapped_type *this_00;
  bool local_4e;
  allocator local_39;
  key_type local_38;
  int local_14;
  World *pWStack_10;
  int admin_count_local;
  World *this_local;
  
  this->admin_count = admin_count;
  local_4e = false;
  local_14 = admin_count;
  pWStack_10 = this;
  if (admin_count == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"FirstCharacterAdmin",&local_39);
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ::operator[](&(this->config).
                            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ,&local_38);
    local_4e = util::variant::operator_cast_to_bool(this_00);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if (local_4e != false) {
    Console::Out("There are no admin characters!");
    Console::Out("The next character created will be given HGM status!");
  }
  return;
}

Assistant:

void World::UpdateAdminCount(int admin_count)
{
	this->admin_count = admin_count;

	if (admin_count == 0 && this->config["FirstCharacterAdmin"])
	{
		Console::Out("There are no admin characters!");
		Console::Out("The next character created will be given HGM status!");
	}
}